

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void lpf_pipeline_mt_init(AV1_COMP *cpi,int num_workers)

{
  _Bool _Var1;
  int iVar2;
  int use_superres_00;
  int use_cdef_00;
  int use_restoration_00;
  uint uVar3;
  AV1_COMMON *cm_00;
  loopfilter *lf_00;
  long lVar4;
  int in_ESI;
  AV1_COMP *in_RDI;
  EncWorkerData *thread_data;
  int i;
  int end_mi_row;
  int start_mi_row;
  int lpf_opt_level;
  int planes_to_lf [3];
  int plane_end;
  int plane_start;
  loopfilter *lf;
  LPF_PICK_METHOD method;
  uint skip_apply_postproc_filters;
  MACROBLOCKD *xd;
  MultiThreadInfo *mt_info;
  int use_restoration;
  int use_cdef;
  int use_superres;
  int use_loopfilter;
  AV1_COMMON *cm;
  LPF_PICK_METHOD in_stack_000000a7;
  AV1_COMP *in_stack_000000a8;
  YV12_BUFFER_CONFIG *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar5;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_5c;
  int in_stack_ffffffffffffffa8;
  MACROBLOCKD *xd_00;
  AV1_COMMON *cm_01;
  
  cm_00 = &in_RDI->common;
  iVar2 = is_loopfilter_used(cm_00);
  use_superres_00 = av1_superres_scaled(cm_00);
  use_cdef_00 = is_cdef_used(cm_00);
  use_restoration_00 = is_restoration_used(cm_00);
  cm_01 = (AV1_COMMON *)&in_RDI->mt_info;
  xd_00 = &(in_RDI->td).mb.e_mbd;
  uVar3 = derive_skip_apply_postproc_filters
                    (in_RDI,iVar2,use_cdef_00,use_superres_00,use_restoration_00);
  uVar5 = false;
  if ((((((in_RDI->oxcf).mode == '\x01') && (uVar5 = false, 4 < (in_RDI->oxcf).speed)) &&
       (uVar5 = false, (in_RDI->sf).lpf_sf.lpf_pick == '\x03')) &&
      ((uVar5 = false, (in_RDI->oxcf).algo_cfg.loopfilter_control != LOOPFILTER_SELECTIVELY &&
       (uVar5 = false, (in_RDI->ppi->rtc_ref).non_reference_frame == 0)))) &&
     (uVar5 = false, ((in_RDI->common).features.allow_intrabc & 1U) == 0)) {
    uVar5 = (uVar3 & 8) == 0;
  }
  *(uint *)((cm_01->quant_params).gqmatrix[2][1] + 2) = (uint)(byte)uVar5;
  if ((*(int *)((cm_01->quant_params).gqmatrix[2][1] + 2) != 0) &&
     (set_postproc_filter_default_params(cm_00), iVar2 != 0)) {
    av1_pick_filter_level(in_stack_000000b0,in_stack_000000a8,in_stack_000000a7);
    lf_00 = &(in_RDI->common).lf;
    iVar2 = av1_num_planes(cm_00);
    _Var1 = lpf_mt_with_enc_enabled((in_RDI->mt_info).pipeline_lpf_mt_with_enc,lf_00->filter_level);
    if (_Var1) {
      set_planes_to_loop_filter(lf_00,&local_5c,0,iVar2);
      iVar2 = get_lpf_opt_level((SPEED_FEATURES *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      av1_loop_filter_frame_init(cm_01,(int)((ulong)xd_00 >> 0x20),(int)xd_00);
      loop_filter_frame_mt_init
                ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,
                 (int *)CONCAT17(uVar5,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c,
                 (AV1LfSync *)
                 CONCAT44(in_stack_ffffffffffffff74,((in_RDI->common).seq_params)->mib_size_log2),
                 iVar2,in_stack_ffffffffffffffa8);
      for (iVar2 = in_ESI + -1; -1 < iVar2; iVar2 = iVar2 + -1) {
        lVar4 = *(long *)&cm_01->render_width + (long)iVar2 * 0x1d0;
        *(RefCntBuffer ***)(lVar4 + 0x1b8) = cm_01->ref_frame_map + 6;
        *(long *)(lVar4 + 0x1c0) = *(long *)(*(long *)(lVar4 + 0x1b8) + 0x50) + (long)iVar2 * 0x2268
        ;
        loop_filter_data_reset
                  (*(LFWorkerData **)(lVar4 + 0x1c0),&((in_RDI->common).cur_frame)->buf,cm_00,xd_00)
        ;
      }
    }
  }
  return;
}

Assistant:

static void lpf_pipeline_mt_init(AV1_COMP *cpi, int num_workers) {
  // Pipelining of loop-filtering after encoding is enabled when loop-filter
  // level is chosen based on quantizer and frame type. It is disabled in case
  // of 'LOOPFILTER_SELECTIVELY' as the stats collected during encoding stage
  // decides the filter level. Loop-filtering is disabled in case
  // of non-reference frames and for frames with intra block copy tool enabled.
  AV1_COMMON *cm = &cpi->common;
  const int use_loopfilter = is_loopfilter_used(cm);
  const int use_superres = av1_superres_scaled(cm);
  const int use_cdef = is_cdef_used(cm);
  const int use_restoration = is_restoration_used(cm);
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  MACROBLOCKD *xd = &cpi->td.mb.e_mbd;

  const unsigned int skip_apply_postproc_filters =
      derive_skip_apply_postproc_filters(cpi, use_loopfilter, use_cdef,
                                         use_superres, use_restoration);
  mt_info->pipeline_lpf_mt_with_enc =
      (cpi->oxcf.mode == REALTIME) && (cpi->oxcf.speed >= 5) &&
      (cpi->sf.lpf_sf.lpf_pick == LPF_PICK_FROM_Q) &&
      (cpi->oxcf.algo_cfg.loopfilter_control != LOOPFILTER_SELECTIVELY) &&
      !cpi->ppi->rtc_ref.non_reference_frame && !cm->features.allow_intrabc &&
      ((skip_apply_postproc_filters & SKIP_APPLY_LOOPFILTER) == 0);

  if (!mt_info->pipeline_lpf_mt_with_enc) return;

  set_postproc_filter_default_params(cm);

  if (!use_loopfilter) return;

  const LPF_PICK_METHOD method = cpi->sf.lpf_sf.lpf_pick;
  assert(method == LPF_PICK_FROM_Q);
  assert(cpi->oxcf.algo_cfg.loopfilter_control != LOOPFILTER_SELECTIVELY);

  av1_pick_filter_level(cpi->source, cpi, method);

  struct loopfilter *lf = &cm->lf;
  const int plane_start = 0;
  const int plane_end = av1_num_planes(cm);
  int planes_to_lf[MAX_MB_PLANE];
  if (lpf_mt_with_enc_enabled(cpi->mt_info.pipeline_lpf_mt_with_enc,
                              lf->filter_level)) {
    set_planes_to_loop_filter(lf, planes_to_lf, plane_start, plane_end);
    int lpf_opt_level = get_lpf_opt_level(&cpi->sf);
    assert(lpf_opt_level == 2);

    const int start_mi_row = 0;
    const int end_mi_row = start_mi_row + cm->mi_params.mi_rows;

    av1_loop_filter_frame_init(cm, plane_start, plane_end);

    assert(mt_info->num_mod_workers[MOD_ENC] ==
           mt_info->num_mod_workers[MOD_LPF]);
    loop_filter_frame_mt_init(cm, start_mi_row, end_mi_row, planes_to_lf,
                              mt_info->num_mod_workers[MOD_LPF],
                              &mt_info->lf_row_sync, lpf_opt_level,
                              cm->seq_params->mib_size_log2);

    for (int i = num_workers - 1; i >= 0; i--) {
      EncWorkerData *const thread_data = &mt_info->tile_thr_data[i];
      // Initialize loopfilter data
      thread_data->lf_sync = &mt_info->lf_row_sync;
      thread_data->lf_data = &thread_data->lf_sync->lfdata[i];
      loop_filter_data_reset(thread_data->lf_data, &cm->cur_frame->buf, cm, xd);
    }
  }
}